

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  u8 uVar1;
  int iVar2;
  Expr *pA;
  
  iVar2 = sqlite3ExprCompare(pParse,pE1,pE2,iTab);
  if (iVar2 == 0) {
    return 1;
  }
  uVar1 = pE2->op;
  if (uVar1 == 'F') {
    iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pLeft,iTab);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pRight,iTab);
    if (iVar2 != 0) {
      return 1;
    }
    uVar1 = pE2->op;
  }
  if (((uVar1 == 'L') && (pE1->op != 'H')) && (pE1->op != 'K')) {
    pA = sqlite3ExprSkipCollate(pE1->pLeft);
    iVar2 = sqlite3ExprCompare(pParse,pA,pE2->pLeft,iTab);
    if (iVar2 == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(Parse *pParse, Expr *pE1, Expr *pE2, int iTab){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL && pE1->op!=TK_ISNULL && pE1->op!=TK_IS ){
    Expr *pX = sqlite3ExprSkipCollate(pE1->pLeft);
    testcase( pX!=pE1->pLeft );
    if( sqlite3ExprCompare(pParse, pX, pE2->pLeft, iTab)==0 ) return 1;
  }
  return 0;
}